

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zesVFManagementSetVFTelemetrySamplingIntervalExp
          (zes_vf_handle_t hVFhandle,zes_vf_info_util_exp_flags_t flag,uint64_t samplingInterval)

{
  ze_result_t zVar1;
  
  if (DAT_0010de00 != (code *)0x0) {
    zVar1 = (*DAT_0010de00)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementSetVFTelemetrySamplingIntervalExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the component.
        zes_vf_info_util_exp_flags_t flag,              ///< [in] utilization flags to set sampling interval. May be 0 or a valid
                                                        ///< combination of ::zes_vf_info_util_exp_flag_t.
        uint64_t samplingInterval                       ///< [in] Sampling interval value.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetVFTelemetrySamplingIntervalExp = context.zesDdiTable.VFManagementExp.pfnSetVFTelemetrySamplingIntervalExp;
        if( nullptr != pfnSetVFTelemetrySamplingIntervalExp )
        {
            result = pfnSetVFTelemetrySamplingIntervalExp( hVFhandle, flag, samplingInterval );
        }
        else
        {
            // generic implementation
        }

        return result;
    }